

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O0

StreamException * __thiscall
Centaurus::Stream::unexpected(StreamException *__return_storage_ptr__,Stream *this,wchar_t ch)

{
  ostream *poVar1;
  void *pvVar2;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream stream;
  wchar_t ch_local;
  Stream *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_line);
  poVar1 = std::operator<<(poVar1,", Pos ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_pos);
  poVar1 = std::operator<<(poVar1,": Unexpected character ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = (void *)std::ostream::operator<<(pvVar2,ch);
  std::ostream::operator<<(pvVar2,std::dec);
  std::__cxx11::ostringstream::str();
  StreamException::StreamException(__return_storage_ptr__,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

StreamException unexpected(wchar_t ch)
    {
        std::ostringstream stream;

        stream << "Line " << m_line << ", Pos " << m_pos << ": Unexpected character " << std::hex << (int)ch << std::dec;

        return StreamException(stream.str());
    }